

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O1

bool spvOperandIsConcrete(spv_operand_type_t type)

{
  if (type - SPV_OPERAND_TYPE_ID < 5) {
switchD_00211a1b_caseD_6:
    return true;
  }
  switch(type) {
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
  case SPV_OPERAND_TYPE_LITERAL_STRING:
  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
  case SPV_OPERAND_TYPE_MEMORY_MODEL:
  case SPV_OPERAND_TYPE_EXECUTION_MODE:
  case SPV_OPERAND_TYPE_STORAGE_CLASS:
  case SPV_OPERAND_TYPE_DIMENSIONALITY:
  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
  case SPV_OPERAND_TYPE_IMAGE_CHANNEL_ORDER:
  case SPV_OPERAND_TYPE_IMAGE_CHANNEL_DATA_TYPE:
  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
  case SPV_OPERAND_TYPE_DECORATION:
  case SPV_OPERAND_TYPE_BUILT_IN:
  case SPV_OPERAND_TYPE_GROUP_OPERATION:
  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
  case SPV_OPERAND_TYPE_CAPABILITY:
  case SPV_OPERAND_TYPE_FPENCODING:
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_FRAGMENT_SHADING_RATE:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
  case SPV_OPERAND_TYPE_FPDENORM_MODE:
  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
  case SPV_OPERAND_TYPE_RAY_FLAGS:
  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_LAYOUT:
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_USE:
  case SPV_OPERAND_TYPE_INITIALIZATION_MODE_QUALIFIER:
  case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
  case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
    goto switchD_00211a1b_caseD_6;
  default:
    return false;
  }
}

Assistant:

bool spvOperandIsConcrete(spv_operand_type_t type) {
  if (spvIsIdType(type) || spvOperandIsConcreteMask(type)) {
    return true;
  }
  switch (type) {
    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
    case SPV_OPERAND_TYPE_LITERAL_STRING:
    case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
    case SPV_OPERAND_TYPE_EXECUTION_MODEL:
    case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
    case SPV_OPERAND_TYPE_MEMORY_MODEL:
    case SPV_OPERAND_TYPE_EXECUTION_MODE:
    case SPV_OPERAND_TYPE_STORAGE_CLASS:
    case SPV_OPERAND_TYPE_DIMENSIONALITY:
    case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
    case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
    case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
    case SPV_OPERAND_TYPE_IMAGE_CHANNEL_ORDER:
    case SPV_OPERAND_TYPE_IMAGE_CHANNEL_DATA_TYPE:
    case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
    case SPV_OPERAND_TYPE_LINKAGE_TYPE:
    case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
    case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
    case SPV_OPERAND_TYPE_DECORATION:
    case SPV_OPERAND_TYPE_BUILT_IN:
    case SPV_OPERAND_TYPE_GROUP_OPERATION:
    case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
    case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
    case SPV_OPERAND_TYPE_CAPABILITY:
    case SPV_OPERAND_TYPE_RAY_FLAGS:
    case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
    case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
    case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
    case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
    case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
    case SPV_OPERAND_TYPE_DEBUG_OPERATION:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
    case SPV_OPERAND_TYPE_FPDENORM_MODE:
    case SPV_OPERAND_TYPE_FPOPERATION_MODE:
    case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
    case SPV_OPERAND_TYPE_OVERFLOW_MODES:
    case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_LAYOUT:
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_USE:
    case SPV_OPERAND_TYPE_INITIALIZATION_MODE_QUALIFIER:
    case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
    case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
    case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
    case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
    case SPV_OPERAND_TYPE_FPENCODING:
      return true;
    default:
      break;
  }
  return false;
}